

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

int __thiscall
google::protobuf::internal::ExtensionSet::GetEnum(ExtensionSet *this,int number,int default_value)

{
  anon_enum_32 *v1;
  anon_enum_32 *v2;
  LogMessage *pLVar1;
  CppType *v1_00;
  CppType *v2_00;
  undefined1 auVar2 [16];
  LogMessageFatal local_98 [23];
  Voidify local_81;
  CppType local_80;
  CppType local_7c;
  string *local_78;
  undefined1 local_60 [16];
  LogMessageFatal local_50 [23];
  Voidify local_39;
  anon_enum_32 local_38;
  anon_enum_32 local_34;
  string *local_30;
  string *absl_log_internal_check_op_result;
  Extension *extension;
  int default_value_local;
  int number_local;
  ExtensionSet *this_local;
  
  extension._0_4_ = default_value;
  extension._4_4_ = number;
  _default_value_local = this;
  absl_log_internal_check_op_result = (string *)FindOrNull(this,number);
  if ((absl_log_internal_check_op_result == (string *)0x0) ||
     ((*(byte *)((long)&absl_log_internal_check_op_result->_M_string_length + 2) >> 1 & 1) != 0)) {
    this_local._4_4_ = (int)extension;
  }
  else {
    local_34 = (anon_enum_32)((absl_log_internal_check_op_result->_M_string_length & 0x100) == 0);
    v1 = absl::lts_20240722::log_internal::
         GetReferenceableValue<google::protobuf::internal::(anonymous_namespace)::__1>(&local_34);
    local_38 = OPTIONAL_FIELD;
    v2 = absl::lts_20240722::log_internal::
         GetReferenceableValue<google::protobuf::internal::(anonymous_namespace)::__1>(&local_38);
    local_30 = absl::lts_20240722::log_internal::
               Check_EQImpl<google::protobuf::internal::(anonymous_namespace)::__1,google::protobuf::internal::(anonymous_namespace)::__1>
                         (v1,v2,
                          "(*extension).is_repeated ? REPEATED_FIELD : OPTIONAL_FIELD == OPTIONAL_FIELD"
                         );
    if (local_30 != (string *)0x0) {
      local_60 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_30);
      absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                (local_50,
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/extension_set.cc"
                 ,0x1d6,local_60._0_8_,local_60._8_8_);
      pLVar1 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_50);
      absl::lts_20240722::log_internal::Voidify::operator&&(&local_39,pLVar1);
      absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_50);
    }
    local_7c = anon_unknown_58::cpp_type
                         ((FieldType)absl_log_internal_check_op_result->_M_string_length);
    v1_00 = absl::lts_20240722::log_internal::
            GetReferenceableValue<google::protobuf::internal::WireFormatLite::CppType>(&local_7c);
    local_80 = CPPTYPE_ENUM;
    v2_00 = absl::lts_20240722::log_internal::
            GetReferenceableValue<google::protobuf::internal::WireFormatLite::CppType>(&local_80);
    local_78 = absl::lts_20240722::log_internal::
               Check_EQImpl<google::protobuf::internal::WireFormatLite::CppType,google::protobuf::internal::WireFormatLite::CppType>
                         (v1_00,v2_00,"cpp_type((*extension).type) == WireFormatLite::CPPTYPE_ENUM")
    ;
    if (local_78 != (string *)0x0) {
      auVar2 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_78);
      absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                (local_98,
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/extension_set.cc"
                 ,0x1d6,auVar2._0_8_,auVar2._8_8_);
      pLVar1 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_98);
      absl::lts_20240722::log_internal::Voidify::operator&&(&local_81,pLVar1);
      absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_98);
    }
    this_local._4_4_ = *(int *)absl_log_internal_check_op_result;
  }
  return this_local._4_4_;
}

Assistant:

int ExtensionSet::GetEnum(int number, int default_value) const {
  const Extension* extension = FindOrNull(number);
  if (extension == nullptr || extension->is_cleared) {
    // Not present.  Return the default value.
    return default_value;
  } else {
    ABSL_DCHECK_TYPE(*extension, OPTIONAL_FIELD, ENUM);
    return extension->enum_value;
  }
}